

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform_dist.hpp
# Opt level: O2

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  undefined4 uVar1;
  long lVar2;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  istream *piVar4;
  long lVar5;
  float b;
  float a;
  delim_c local_23;
  delim_c local_22;
  delim_c local_21;
  float local_20;
  float local_1c;
  
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_21.c = '(';
  pbVar3 = utility::operator>>(in,&local_21);
  piVar4 = std::istream::_M_extract<float>((float *)pbVar3);
  local_22.c = ' ';
  pbVar3 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar4,&local_22);
  piVar4 = std::istream::_M_extract<float>((float *)pbVar3);
  local_23.c = ')';
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar4,&local_23);
  lVar2 = *(long *)in;
  lVar5 = *(long *)(lVar2 + -0x18);
  if (((byte)in[lVar5 + 0x20] & 5) == 0) {
    P->a_ = local_1c;
    P->b_ = local_20;
    P->d_ = local_20 - local_1c;
    lVar5 = *(long *)(lVar2 + -0x18);
  }
  *(undefined4 *)(in + lVar5 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &P) {
        float_t a, b;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> a >> utility::delim(' ') >> b >> utility::delim(')');
        if (in)
          P = param_type(a, b);
        in.flags(flags);
        return in;
      }